

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qfilesystemmodel.cpp
# Opt level: O2

void __thiscall QFileSystemModel::setNameFilters(QFileSystemModel *this,QStringList *filters)

{
  QHash<const_QFileSystemModelPrivate::QFileSystemNode_*,_bool> *this_00;
  QFileSystemModelPrivate *this_01;
  Data *pDVar1;
  bool bVar2;
  bool *pbVar3;
  QModelIndex *persistentIndex;
  QModelIndex *index;
  QModelIndex *pQVar4;
  long in_FS_OFFSET;
  QPersistentModelIndex root;
  QArrayDataPointer<char16_t> local_70;
  Data *local_58;
  QModelIndex *pQStack_50;
  totally_ordered_wrapper<const_QAbstractItemModel_*> local_48;
  QPersistentModelIndex local_40;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  this_01 = *(QFileSystemModelPrivate **)&this->field_0x8;
  pDVar1 = (this_01->bypassFilters).d;
  if ((pDVar1 != (Data *)0x0) && (pDVar1->size != 0)) {
    this_00 = &this_01->bypassFilters;
    QHash<const_QFileSystemModelPrivate::QFileSystemNode_*,_bool>::clear(this_00);
    local_40.d = (QPersistentModelIndexData *)&DAT_aaaaaaaaaaaaaaaa;
    rootPath((QString *)&local_70,this);
    QFileSystemModel::index((QFileSystemModel *)&local_58,(char *)this,(int)&local_70);
    QPersistentModelIndex::QPersistentModelIndex(&local_40,(QModelIndex *)&local_58);
    QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_70);
    local_48.ptr = (QAbstractItemModel *)&DAT_aaaaaaaaaaaaaaaa;
    local_58 = (Data *)&DAT_aaaaaaaaaaaaaaaa;
    pQStack_50 = (QModelIndex *)&DAT_aaaaaaaaaaaaaaaa;
    QAbstractItemModel::persistentIndexList();
    pQVar4 = pQStack_50 + (long)local_48.ptr;
    for (index = pQStack_50; index != pQVar4; index = index + 1) {
      for (local_70.d = (Data *)QFileSystemModelPrivate::node(this_01,index);
          (QFileSystemNode *)local_70.d != (QFileSystemNode *)0x0;
          local_70.d = *(Data **)((long)local_70.d + 0x40)) {
        bVar2 = QHash<const_QFileSystemModelPrivate::QFileSystemNode_*,_bool>::contains
                          (this_00,(QFileSystemNode **)&local_70);
        if (bVar2) break;
        bVar2 = QFileSystemModelPrivate::QFileSystemNode::isDir((QFileSystemNode *)local_70.d);
        if (bVar2) {
          pbVar3 = QHash<const_QFileSystemModelPrivate::QFileSystemNode_*,_bool>::operator[]
                             (this_00,(QFileSystemNode **)&local_70);
          *pbVar3 = true;
        }
      }
    }
    QArrayDataPointer<QModelIndex>::~QArrayDataPointer((QArrayDataPointer<QModelIndex> *)&local_58);
    QPersistentModelIndex::~QPersistentModelIndex(&local_40);
  }
  QArrayDataPointer<QString>::operator=(&(this_01->nameFilters).d,&filters->d);
  QFileSystemModelPrivate::rebuildNameFilterRegexps(this_01);
  this_01->forceSort = true;
  QFileSystemModelPrivate::delayedSort(this_01);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QFileSystemModel::setNameFilters(const QStringList &filters)
{
#if QT_CONFIG(regularexpression)
    Q_D(QFileSystemModel);

    if (!d->bypassFilters.isEmpty()) {
        // update the bypass filter to only bypass the stuff that must be kept around
        d->bypassFilters.clear();
        // We guarantee that rootPath will stick around
        QPersistentModelIndex root(index(rootPath()));
        const QModelIndexList persistentList = persistentIndexList();
        for (const auto &persistentIndex : persistentList) {
            QFileSystemModelPrivate::QFileSystemNode *node = d->node(persistentIndex);
            while (node) {
                if (d->bypassFilters.contains(node))
                    break;
                if (node->isDir())
                    d->bypassFilters[node] = true;
                node = node->parent;
            }
        }
    }

    d->nameFilters = filters;
    d->rebuildNameFilterRegexps();
    d->forceSort = true;
    d->delayedSort();
#else
    Q_UNUSED(filters);
#endif
}